

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_setfenv(lua_State *L)

{
  StkId pTVar1;
  int iVar2;
  ulong uVar3;
  char *extramsg;
  int idx;
  lua_Number lVar4;
  lua_Debug local_90;
  
  luaL_checktype(L,2,5);
  iVar2 = lua_type(L,1);
  if (iVar2 == 6) {
    lua_pushvalue(L,1);
LAB_00109178:
    lua_pushvalue(L,2);
    idx = 1;
    iVar2 = lua_isnumber(L,1);
    if (iVar2 != 0) {
      idx = 1;
      lVar4 = lua_tonumber(L,1);
      if ((lVar4 == 0.0) && (!NAN(lVar4))) {
        pTVar1 = L->top;
        (pTVar1->value).gc = (GCObject *)L;
        pTVar1->tt = 8;
        L->top = L->top + 1;
        iVar2 = -2;
        lua_insert(L,-2);
        lua_setfenv(L,iVar2);
        return 0;
      }
    }
    if (((L->top[-2].tt != 6) || (((L->top[-2].value.gc)->h).flags == '\0')) &&
       (iVar2 = lua_setfenv(L,idx), iVar2 != 0)) {
      return 1;
    }
    luaL_error(L,"\'setfenv\' cannot change environment of given object");
  }
  uVar3 = luaL_checkinteger(L,1);
  if ((int)uVar3 < 0) {
    extramsg = "level must be non-negative";
  }
  else {
    iVar2 = lua_getstack(L,(int)uVar3,&local_90);
    if (iVar2 != 0) {
      lua_getinfo(L,"f",&local_90);
      iVar2 = lua_type(L,-1);
      if (iVar2 == 0) {
        luaL_error(L,"no function environment for tail call at level %d",uVar3 & 0xffffffff);
      }
      goto LAB_00109178;
    }
    extramsg = "invalid level";
  }
  luaL_argerror(L,1,extramsg);
}

Assistant:

static int luaB_setfenv(lua_State*L){
luaL_checktype(L,2,5);
getfunc(L,0);
lua_pushvalue(L,2);
if(lua_isnumber(L,1)&&lua_tonumber(L,1)==0){
lua_pushthread(L);
lua_insert(L,-2);
lua_setfenv(L,-2);
return 0;
}
else if(lua_iscfunction(L,-2)||lua_setfenv(L,-2)==0)
luaL_error(L,
LUA_QL("setfenv")" cannot change environment of given object");
return 1;
}